

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdir-posix.c
# Opt level: O0

pboolean p_dir_remove(pchar *path,PError **error)

{
  pboolean pVar1;
  int iVar2;
  PErrorIO code;
  pint native_code;
  PError **error_local;
  pchar *path_local;
  
  if (path == (pchar *)0x0) {
    p_error_set_error_p(error,0x1fb,0,"Invalid input argument");
    path_local._4_4_ = 0;
  }
  else {
    pVar1 = p_dir_is_exists(path);
    if (pVar1 == 0) {
      p_error_set_error_p(error,0x207,0,"Specified directory doesn\'t exist");
      path_local._4_4_ = 0;
    }
    else {
      iVar2 = rmdir(path);
      if (iVar2 == 0) {
        path_local._4_4_ = 1;
      }
      else {
        code = p_error_get_last_io();
        native_code = p_error_get_last_system();
        p_error_set_error_p(error,code,native_code,"Failed to call rmdir() to remove directory");
        path_local._4_4_ = 0;
      }
    }
  }
  return path_local._4_4_;
}

Assistant:

P_LIB_API pboolean
p_dir_remove (const pchar	*path,
	      PError		**error)
{
	if (P_UNLIKELY (path == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	if (!p_dir_is_exists (path)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_NOT_EXISTS,
				     0,
				     "Specified directory doesn't exist");
		return FALSE;
	}

	if (P_UNLIKELY (rmdir (path) != 0)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_last_io (),
				     p_error_get_last_system (),
				     "Failed to call rmdir() to remove directory");
		return FALSE;
	} else
		return TRUE;
}